

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

char * __thiscall
ASDCP::MXF::ISO8String::EncodeString(ISO8String *this,char *str_buf,ui32_t buf_len)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)(this->super_string)._M_string_length;
  uVar2 = buf_len - 1;
  if (uVar1 <= buf_len - 1) {
    uVar2 = uVar1;
  }
  strncpy(str_buf,(this->super_string)._M_dataplus._M_p,(ulong)uVar2);
  str_buf[uVar2] = '\0';
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::ISO8String::EncodeString(char* str_buf, ui32_t buf_len) const
{
  ui32_t write_len = Kumu::xmin(buf_len - 1, (ui32_t)size());
  strncpy(str_buf, c_str(), write_len);
  str_buf[write_len] = 0;
  return str_buf;
}